

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

RawSchema * __thiscall capnp::SchemaLoader::Impl::loadNative(Impl *this,RawSchema *nativeSchema)

{
  Initializer *pIVar1;
  uint64_t uVar2;
  word *pwVar3;
  RawSchema **ppRVar4;
  uint16_t *puVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  undefined4 uVar9;
  bool bVar10;
  Maybe<capnp::_::RawSchema_*&> MVar11;
  RawSchema *value;
  RawSchema *pRVar12;
  Maybe<capnp::SchemaLoader::Impl::RequiredSize_&> MVar13;
  uint i;
  ulong uVar14;
  bool bVar15;
  ArrayPtr<const_capnp::_::RawSchema_*> AVar16;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar17;
  Fault f;
  CompatibilityChecker checker;
  ArrayPtr<const_char> local_b8;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_a8;
  Reader native;
  Reader existing;
  
  MVar11 = kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long_const&>
                     ((HashMap<unsigned_long,capnp::_::RawSchema*> *)&this->schemas,
                      &nativeSchema->id);
  if (MVar11.ptr == (RawSchema **)0x0) {
    value = kj::Arena::allocate<capnp::_::RawSchema>(&this->arena);
    (value->defaultBrand).scopes = (Scope *)0x0;
    (value->defaultBrand).dependencies = (Dependency *)0x0;
    (value->defaultBrand).scopeCount = 0;
    (value->defaultBrand).dependencyCount = 0;
    (value->defaultBrand).lazyInitializer = (Initializer *)0x0;
    (value->defaultBrand).generic = value;
    value->lazyInitializer = (Initializer *)0x0;
    kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::insert(&this->schemas,nativeSchema->id,value)
    ;
    bVar15 = false;
  }
  else {
    value = *MVar11.ptr;
    if (value->canCastTo != (RawSchema *)0x0) {
      if (value->canCastTo == nativeSchema) {
        return value;
      }
      readMessageUnchecked<capnp::schema::Node>((Reader *)&checker,nativeSchema->encodedNode);
      native._reader._0_16_ = capnp::schema::Node::Reader::getDisplayName((Reader *)&checker);
      readMessageUnchecked<capnp::schema::Node>(&existing,value->canCastTo->encodedNode);
      local_b8 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&existing);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,char_const(&)[53],unsigned_long_const&,capnp::Text::Reader,capnp::Text::Reader>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x52e,FAILED,"schema->canCastTo == nativeSchema",
                 "\"two different compiled-in type have the same type ID\", nativeSchema->id, readMessageUnchecked<schema::Node>(nativeSchema->encodedNode).getDisplayName(), readMessageUnchecked<schema::Node>(schema->canCastTo->encodedNode).getDisplayName()"
                 ,(char (*) [53])"two different compiled-in type have the same type ID",
                 &nativeSchema->id,(Reader *)&native,(Reader *)&local_b8);
      kj::_::Debug::Fault::fatal(&f);
    }
    readMessageUnchecked<capnp::schema::Node>(&existing,value->encodedNode);
    readMessageUnchecked<capnp::schema::Node>(&native,nativeSchema->encodedNode);
    checker.nodeName.super_StringPtr.content.ptr = "";
    checker.nodeName.super_StringPtr.content.size_ = 1;
    checker.existingNode._reader.segment = (SegmentReader *)0x0;
    checker.existingNode._reader.capTable = (CapTableReader *)0x0;
    checker.existingNode._reader.data = (void *)0x0;
    checker.existingNode._reader.pointers._0_6_ = 0;
    checker.existingNode._reader.pointers._6_2_ = 0;
    checker.existingNode._reader.dataSize = 0;
    checker.existingNode._reader.pointerCount = 0;
    checker.existingNode._reader.nestingLimit = 0x7fffffff;
    checker.replacementNode._reader.segment = (SegmentReader *)0x0;
    checker.replacementNode._reader.capTable = (CapTableReader *)0x0;
    checker.replacementNode._reader.data = (void *)0x0;
    checker.replacementNode._reader.pointers._0_6_ = 0;
    checker.replacementNode._reader.pointers._6_2_ = 0;
    checker.replacementNode._reader.dataSize = 0;
    checker.replacementNode._reader.pointerCount = 0;
    checker.replacementNode._reader.nestingLimit = 0x7fffffff;
    checker.loader = this;
    bVar10 = CompatibilityChecker::shouldReplace(&checker,&existing,&native,true);
    pIVar1 = value->lazyInitializer;
    bVar15 = pIVar1 != (Initializer *)0x0;
    if (!bVar10) {
      value->canCastTo = nativeSchema;
      for (uVar14 = 0; uVar14 < nativeSchema->dependencyCount; uVar14 = uVar14 + 1) {
        loadNative(this,nativeSchema->dependencies[uVar14]);
      }
      if (pIVar1 == (Initializer *)0x0) {
        return value;
      }
      goto LAB_001a5769;
    }
  }
  checker.existingNode._reader.capTable =
       (CapTableReader *)(nativeSchema->defaultBrand).lazyInitializer;
  checker.loader = (Impl *)(nativeSchema->defaultBrand).generic;
  checker.nodeName.super_StringPtr.content.ptr = (char *)(nativeSchema->defaultBrand).scopes;
  checker.nodeName.super_StringPtr.content.size_ = (size_t)(nativeSchema->defaultBrand).dependencies
  ;
  checker.existingNode._reader.segment = *(SegmentReader **)&(nativeSchema->defaultBrand).scopeCount
  ;
  uVar2 = nativeSchema->id;
  pwVar3 = nativeSchema->encodedNode;
  uVar8 = nativeSchema->encodedSize;
  uVar9 = *(undefined4 *)&nativeSchema->field_0x14;
  ppRVar4 = nativeSchema->dependencies;
  puVar5 = nativeSchema->membersByName;
  uVar6 = nativeSchema->dependencyCount;
  uVar7 = nativeSchema->memberCount;
  pRVar12 = nativeSchema->canCastTo;
  value->membersByDiscriminant = nativeSchema->membersByDiscriminant;
  value->canCastTo = pRVar12;
  value->membersByName = puVar5;
  value->dependencyCount = uVar6;
  value->memberCount = uVar7;
  value->encodedSize = uVar8;
  *(undefined4 *)&value->field_0x14 = uVar9;
  value->dependencies = ppRVar4;
  value->id = uVar2;
  value->encodedNode = pwVar3;
  (value->defaultBrand).generic = (RawSchema *)checker.loader;
  (value->defaultBrand).scopes = (Scope *)checker.nodeName.super_StringPtr.content.ptr;
  (value->defaultBrand).dependencies = (Dependency *)checker.nodeName.super_StringPtr.content.size_;
  *(SegmentReader **)&(value->defaultBrand).scopeCount = checker.existingNode._reader.segment;
  (value->defaultBrand).lazyInitializer = (Initializer *)checker.existingNode._reader.capTable;
  (value->defaultBrand).generic = value;
  value->canCastTo = nativeSchema;
  AVar16 = kj::Arena::allocateArray<capnp::_::RawSchema_const*>
                     (&this->arena,(ulong)value->dependencyCount);
  for (uVar14 = 0; uVar14 < nativeSchema->dependencyCount; uVar14 = uVar14 + 1) {
    pRVar12 = loadNative(this,nativeSchema->dependencies[uVar14]);
    AVar16.ptr[uVar14] = pRVar12;
  }
  value->dependencies = AVar16.ptr;
  local_a8.ptr.field_1.value.ptr = (Scope *)0x0;
  local_a8.ptr.field_1.value.size_ = 0;
  local_a8.ptr.isSet = true;
  AVar17 = makeBrandedDependencies(this,value,&local_a8);
  (value->defaultBrand).dependencies = AVar17.ptr;
  (value->defaultBrand).dependencyCount = (uint32_t)AVar17.size_;
  MVar13 = kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::
           find<unsigned_long_const&>
                     ((HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize> *)
                      &this->structSizeRequirements,&nativeSchema->id);
  if (MVar13.ptr != (RequiredSize *)0x0) {
    applyStructSizeRequirement
              (this,value,(uint)(MVar13.ptr)->dataWordCount,(uint)(MVar13.ptr)->pointerCount);
  }
  if (!bVar15) {
    return value;
  }
LAB_001a5769:
  value->lazyInitializer = (Initializer *)0x0;
  (value->defaultBrand).lazyInitializer = (Initializer *)0x0;
  return value;
}

Assistant:

_::RawSchema* SchemaLoader::Impl::loadNative(const _::RawSchema* nativeSchema) {
  _::RawSchema* schema;
  bool shouldReplace;
  bool shouldClearInitializer;
  KJ_IF_MAYBE(match, schemas.find(nativeSchema->id)) {
    schema = *match;
    if (schema->canCastTo != nullptr) {
      // Already loaded natively, or we're currently in the process of loading natively and there
      // was a dependency cycle.
      KJ_REQUIRE(schema->canCastTo == nativeSchema,
          "two different compiled-in type have the same type ID",
          nativeSchema->id,
          readMessageUnchecked<schema::Node>(nativeSchema->encodedNode).getDisplayName(),
          readMessageUnchecked<schema::Node>(schema->canCastTo->encodedNode).getDisplayName());
      return schema;
    } else {
      auto existing = readMessageUnchecked<schema::Node>(schema->encodedNode);
      auto native = readMessageUnchecked<schema::Node>(nativeSchema->encodedNode);
      CompatibilityChecker checker(*this);
      shouldReplace = checker.shouldReplace(existing, native, true);
      shouldClearInitializer = schema->lazyInitializer != nullptr;
    }
  } else {
    schema = &arena.allocate<_::RawSchema>();
    memset(&schema->defaultBrand, 0, sizeof(schema->defaultBrand));
    schema->defaultBrand.generic = schema;
    schema->lazyInitializer = nullptr;
    schema->defaultBrand.lazyInitializer = nullptr;
    shouldReplace = true;
    shouldClearInitializer = false;  // already cleared above
    schemas.insert(nativeSchema->id, schema);
  }